

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O0

void __thiscall
SSTableCache::SSTableCache
          (SSTableCache *this,SkipList *memTable,uint64_t timeStamp,string *_fileName)

{
  bool bVar1;
  int iVar2;
  unsigned_long uVar3;
  uint64_t uVar4;
  uint64_t *__args;
  int local_48;
  uint local_44;
  ConstIterator CStack_40;
  uint32_t offset;
  ConstIterator i;
  string *_fileName_local;
  uint64_t timeStamp_local;
  SkipList *memTable_local;
  SSTableCache *this_local;
  
  SSTableHeader::SSTableHeader(&this->header);
  std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>::
  vector(&this->index);
  BloomFilter::BloomFilter(&this->bloomFilter,memTable);
  std::__cxx11::string::string((string *)&this->fileName,(string *)_fileName);
  uVar3 = SkipList::getLength(memTable);
  (this->header).length = uVar3;
  uVar4 = SkipList::getMinKey(memTable);
  (this->header).minKey = uVar4;
  uVar4 = SkipList::getMaxKey(memTable);
  (this->header).maxKey = uVar4;
  (this->header).timeStamp = timeStamp;
  CStack_40 = SkipList::constBegin(memTable);
  local_44 = 0;
  while( true ) {
    bVar1 = SkipList::ConstIterator::hasNext(&stack0xffffffffffffffc0);
    if (!bVar1) break;
    SkipList::ConstIterator::next(&stack0xffffffffffffffc0);
    __args = SkipList::ConstIterator::key(&stack0xffffffffffffffc0);
    std::vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>>::
    emplace_back<unsigned_long_const&,unsigned_int&>
              ((vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>> *)
               &this->index,__args,&local_44);
    SkipList::ConstIterator::value_abi_cxx11_(&stack0xffffffffffffffc0);
    iVar2 = std::__cxx11::string::size();
    local_44 = local_44 + iVar2;
  }
  local_48 = 0;
  std::vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>>::
  emplace_back<int,unsigned_int&>
            ((vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>> *)
             &this->index,&local_48,&local_44);
  return;
}

Assistant:

SSTableCache::SSTableCache(const SkipList &memTable, uint64_t timeStamp,
                           string _fileName)
    : bloomFilter(memTable), fileName(std::move(_fileName)) {
  header.length = memTable.getLength();
  header.minKey = memTable.getMinKey();
  header.maxKey = memTable.getMaxKey();
  header.timeStamp = timeStamp;

  auto i = memTable.constBegin();
  uint32_t offset = 0;
  while (i.hasNext()) {
    i.next();
    index.emplace_back(i.key(), offset);
    offset += i.value().size();
  }
  index.emplace_back(0, offset);
}